

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_stream.c
# Opt level: O3

MemoryStream * MemoryStream_Create(_Bool free_buffer_when_destroyed)

{
  MemoryStream *pMVar1;
  uchar *puVar2;
  
  pMVar1 = (MemoryStream *)malloc(0x28);
  puVar2 = (uchar *)malloc(1);
  pMVar1->buffer = puVar2;
  pMVar1->position = 0;
  pMVar1->end = 0;
  pMVar1->size = 1;
  pMVar1->free_buffer_when_destroyed = free_buffer_when_destroyed;
  return pMVar1;
}

Assistant:

MemoryStream* MemoryStream_Create(bool free_buffer_when_destroyed)
{
	MemoryStream *memory_stream = (MemoryStream*)malloc(sizeof(MemoryStream));
	memory_stream->buffer = (unsigned char*)malloc(1);
	memory_stream->position = 0;
	memory_stream->end = 0;
	memory_stream->size = 1;
	memory_stream->free_buffer_when_destroyed = free_buffer_when_destroyed;
	return memory_stream;
}